

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  StkId pSVar5;
  Proto *pPVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  Table *t;
  StkId pSVar11;
  size_t srclen;
  byte *pbVar12;
  char *pcVar13;
  CallInfo *pCVar14;
  ulong uVar15;
  long lVar16;
  Table *x_;
  int local_64;
  byte *local_60;
  TValue local_40;
  
  if (*what == '>') {
    pSVar11 = (StkId)((L->top).offset + -0x10);
    local_60 = (byte *)(what + 1);
    (L->top).p = pSVar11;
    pCVar14 = (CallInfo *)0x0;
  }
  else {
    pCVar14 = ar->i_ci;
    pSVar11 = (pCVar14->func).p;
    local_60 = (byte *)what;
  }
  if (((pSVar11->val).tt_ | 0x20) == 0x66) {
    lVar16 = *(long *)pSVar11;
  }
  else {
    lVar16 = 0;
  }
  local_64 = 1;
  pbVar12 = local_60;
  do {
    bVar1 = *pbVar12;
    if (bVar1 < 0x66) {
      if (bVar1 != 0x4c) {
        if (bVar1 != 0x53) {
          if (bVar1 == 0) {
            pcVar13 = strchr((char *)local_60,0x66);
            if (pcVar13 != (char *)0x0) {
              pSVar5 = (L->top).p;
              *(Value *)pSVar5 = (pSVar11->val).value_;
              (pSVar5->val).tt_ = (pSVar11->val).tt_;
              (L->top).p = (StkId)((L->top).offset + 0x10);
            }
            pcVar13 = strchr((char *)local_60,0x4c);
            if (pcVar13 != (char *)0x0) {
              if ((lVar16 == 0) || (*(char *)(lVar16 + 8) != '\x06')) {
                *(undefined1 *)((L->top).offset + 8) = 0;
                (L->top).p = (StkId)((L->top).offset + 0x10);
              }
              else {
                pPVar6 = *(Proto **)(lVar16 + 0x18);
                iVar9 = pPVar6->linedefined;
                t = luaH_new(L);
                pSVar11 = (L->top).p;
                *(Table **)pSVar11 = t;
                (pSVar11->val).tt_ = 'E';
                (L->top).p = (StkId)((L->top).offset + 0x10);
                if (pPVar6->lineinfo != (char *)0x0) {
                  local_40.tt_ = '\x11';
                  uVar7 = 0;
                  if ((pPVar6->flag & 1) != 0) {
                    iVar8 = (int)*pPVar6->lineinfo;
                    if (iVar8 == -0x80) {
                      iVar9 = luaG_getfuncline(pPVar6,0);
                    }
                    else {
                      iVar9 = iVar9 + iVar8;
                    }
                    uVar7 = 1;
                  }
                  if ((int)uVar7 < pPVar6->sizelineinfo) {
                    uVar15 = (ulong)uVar7;
                    do {
                      if (pPVar6->lineinfo[uVar15] == -0x80) {
                        iVar9 = luaG_getfuncline(pPVar6,(int)uVar15);
                      }
                      else {
                        iVar9 = iVar9 + pPVar6->lineinfo[uVar15];
                      }
                      luaH_setint(L,t,(long)iVar9,&local_40);
                      uVar15 = uVar15 + 1;
                    } while ((int)uVar15 < pPVar6->sizelineinfo);
                  }
                }
              }
            }
            return local_64;
          }
          goto switchD_0010a251_caseD_6d;
        }
        if ((lVar16 == 0) || (*(char *)(lVar16 + 8) != '\x06')) {
          pcVar13 = "=[C]";
          ar->source = "=[C]";
          ar->srclen = 4;
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          srclen = 4;
          pcVar10 = "C";
        }
        else {
          lVar2 = *(long *)(lVar16 + 0x18);
          lVar3 = *(long *)(lVar2 + 0x70);
          if (lVar3 == 0) {
            pcVar13 = "=?";
            ar->source = "=?";
            ar->srclen = 2;
            srclen = 2;
          }
          else {
            srclen = (size_t)*(char *)(lVar3 + 0xb);
            if ((long)srclen < 0) {
              srclen = *(size_t *)(lVar3 + 0x10);
              pcVar13 = *(char **)(lVar3 + 0x18);
            }
            else {
              pcVar13 = (char *)(lVar3 + 0x18);
            }
            ar->srclen = srclen;
            ar->source = pcVar13;
          }
          uVar4 = *(undefined8 *)(lVar2 + 0x2c);
          ar->linedefined = (int)uVar4;
          ar->lastlinedefined = (int)((ulong)uVar4 >> 0x20);
          pcVar10 = "Lua";
          if ((int)uVar4 == 0) {
            pcVar10 = "main";
          }
        }
        ar->what = pcVar10;
        luaO_chunkid(ar->short_src,pcVar13,srclen);
      }
    }
    else {
      switch(bVar1) {
      case 0x6c:
        iVar9 = -1;
        if ((pCVar14 != (CallInfo *)0x0) && ((pCVar14->callstatus & 0x8000) == 0)) {
          pPVar6 = *(Proto **)((((pCVar14->func).p)->val).value_.f + 0x18);
          iVar9 = luaG_getfuncline(pPVar6,(int)((ulong)((long)(pCVar14->u).l.savedpc -
                                                       (long)pPVar6->code) >> 2) + -1);
        }
        ar->currentline = iVar9;
        break;
      case 0x6d:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0010a251_caseD_6d:
        local_64 = 0;
        break;
      case 0x6e:
        if ((pCVar14 != (CallInfo *)0x0) && ((pCVar14->callstatus & 0x400000) == 0)) {
          pcVar13 = funcnamefromcall(L,pCVar14->previous,&ar->name);
          ar->namewhat = pcVar13;
          if (pcVar13 != (char *)0x0) break;
        }
        ar->namewhat = "";
        ar->name = (char *)0x0;
        break;
      case 0x72:
        if ((pCVar14 == (CallInfo *)0x0) || ((pCVar14->callstatus & 0x100000) == 0)) {
          ar->ftransfer = 0;
          ar->ntransfer = 0;
        }
        else {
          iVar9 = (L->transferinfo).ntransfer;
          ar->ftransfer = (L->transferinfo).ftransfer;
          ar->ntransfer = iVar9;
        }
        break;
      case 0x74:
        if (pCVar14 == (CallInfo *)0x0) {
          ar->extraargs = '\0';
          ar->istailcall = '\0';
        }
        else {
          uVar7 = pCVar14->callstatus;
          ar->istailcall = (byte)(uVar7 >> 0x16) & 1;
          ar->extraargs = (byte)(uVar7 >> 8) & 0xf;
        }
        break;
      case 0x75:
        if (lVar16 == 0) {
          ar->nups = '\0';
        }
        else {
          ar->nups = *(uchar *)(lVar16 + 10);
          if (*(char *)(lVar16 + 8) == '\x06') {
            ar->isvararg = *(byte *)(*(long *)(lVar16 + 0x18) + 0xb) & 1;
            ar->nparams = *(uchar *)(*(long *)(lVar16 + 0x18) + 10);
            break;
          }
        }
        ar->nparams = '\0';
        ar->isvararg = '\x01';
        break;
      default:
        if (bVar1 != 0x66) goto switchD_0010a251_caseD_6d;
      }
    }
    pbVar12 = pbVar12 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}